

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

Section * elf_dyntable(GlobalVars *gv,unsigned_long initial_size,unsigned_long initial_offset,
                      uint8_t sectype,uint8_t secflags,uint8_t secprot,int type)

{
  Symbol *pSVar1;
  unsigned_long in_RDX;
  GlobalVars *in_RSI;
  long in_RDI;
  uint in_stack_00000008;
  int symidx;
  ObjectUnit *ou;
  Section **secp;
  Section *sec;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  int idx;
  int iVar4;
  uint8_t *in_stack_ffffffffffffffc0;
  Section **in_stack_ffffffffffffffc8;
  unsigned_long uVar5;
  uint8_t align;
  GlobalVars *pGVar6;
  Section *local_8;
  
  iVar4 = -1;
  uVar5 = in_RDX;
  pGVar6 = in_RSI;
  if (in_stack_00000008 == 1) {
    in_stack_ffffffffffffffc8 = &gotsec;
    iVar4 = 4;
  }
  else if (in_stack_00000008 == 2) {
    in_stack_ffffffffffffffc8 = &pltsec;
    iVar4 = 5;
  }
  else {
    ierror("%s wrong type: %d","elf_dyntable():",(ulong)in_stack_00000008);
  }
  idx = (int)(in_RDX >> 0x20);
  align = (uint8_t)pGVar6;
  local_8 = *in_stack_ffffffffffffffc8;
  if (local_8 == (Section *)0x0) {
    if (*(long *)(in_RDI + 0x1f8) == 0) {
      ierror("%s no dynobj","elf_dyntable():");
    }
    uVar2 = 2;
    uVar3 = 1;
    local_8 = add_section((ObjectUnit *)local_8,(char *)in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc0,CONCAT44(iVar4,in_stack_00000008),
                          (uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                          (uint8_t)uVar5,align,(bool)in_RDI);
    local_8->offset = uVar5;
    *in_stack_ffffffffffffffc8 = local_8;
    if ((-1 < iVar4) &&
       (pSVar1 = findlnksymbol((GlobalVars *)CONCAT44(in_stack_ffffffffffffff9c,uVar3),
                               (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2)),
       pSVar1 == (Symbol *)0x0)) {
      elf_makelnksym(in_RSI,idx);
    }
  }
  return local_8;
}

Assistant:

struct Section *elf_dyntable(struct GlobalVars *gv,
                             unsigned long initial_size,
                             unsigned long initial_offset,
                             uint8_t sectype,uint8_t secflags,
                             uint8_t secprot,int type)
/* return got/plt section, create new when missing */
{
  static const char fn[] = "elf_dyntable():";
  static const char *secname[] = { NULL, got_name, plt_name };
  struct Section *sec,**secp;
  struct ObjectUnit *ou;
  int symidx = -1;

  switch (type) {
    case GOT_ENTRY:
      secp = &gotsec;
      symidx = GLOBOFFSTAB;
      break;
    case PLT_ENTRY:
      secp = &pltsec;
      symidx = PROCLINKTAB;
      break;
    default:
      ierror("%s wrong type: %d",fn,type);
      break;
  }
  if (sec = *secp)
    return sec;

  if (gv->dynobj == NULL)
    ierror("%s no dynobj",fn);

  /* Section does not exist - create it.
     The offset field is used for the next table entry offset. */
  sec = add_section(gv->dynobj,(char *)secname[type],NULL,initial_size,
                    sectype,secflags,secprot,2,TRUE);
  sec->offset = initial_offset;
  *secp = sec;

  /* create _GLOBAL_OFFSET_TABLE_ or _PROCEDURE_LINKAGE_TABLE_ linker symbol */
  if (symidx >= 0) {
    if (!findlnksymbol(gv,elf_symnames[symidx]))
      elf_makelnksym(gv,symidx);
  }

  return sec;
}